

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

String testing::internal::StreamableToString<char*>(char **streamable)

{
  size_t extraout_RDX;
  Message *in_RSI;
  char *in_RDI;
  String SVar1;
  Message *this;
  Message *in_stack_ffffffffffffffd0;
  Message local_18;
  
  this = &local_18;
  Message::Message(in_RSI);
  Message::operator<<(in_stack_ffffffffffffffd0,(char **)this);
  Message::GetString(this);
  Message::~Message((Message *)0x267449);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = in_RDI;
  return SVar1;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}